

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTruth.c
# Opt level: O1

uint * Aig_ManCutTruth(Aig_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,Vec_Ptr_t *vTruthElem,
                      Vec_Ptr_t *vTruthStore)

{
  uint uVar1;
  Aig_Obj_t *pNode;
  uint *pTruth;
  int nWords;
  int iVar2;
  long lVar3;
  
  if (vTruthElem->nSize < vLeaves->nSize) {
    __assert_fail("Vec_PtrSize(vLeaves) <= Vec_PtrSize(vTruthElem)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTruth.c"
                  ,0x54,
                  "unsigned int *Aig_ManCutTruth(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  uVar1 = vNodes->nSize;
  if (vTruthStore->nSize < (int)uVar1) {
    __assert_fail("Vec_PtrSize(vNodes) <= Vec_PtrSize(vTruthStore)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTruth.c"
                  ,0x55,
                  "unsigned int *Aig_ManCutTruth(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if ((ulong)uVar1 != 0) {
    if ((int)uVar1 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
    }
    if ((Aig_Obj_t *)vNodes->pArray[(ulong)uVar1 - 1] != pRoot) {
      __assert_fail("Vec_PtrSize(vNodes) == 0 || pRoot == Vec_PtrEntryLast(vNodes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTruth.c"
                    ,0x56,
                    "unsigned int *Aig_ManCutTruth(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
  }
  iVar2 = vLeaves->nSize;
  if (0 < iVar2) {
    lVar3 = 0;
    do {
      if (vTruthElem->nSize <= lVar3) goto LAB_006cb83c;
      *(void **)((long)vLeaves->pArray[lVar3] + 0x28) = vTruthElem->pArray[lVar3];
      lVar3 = lVar3 + 1;
      iVar2 = vLeaves->nSize;
    } while (lVar3 < iVar2);
  }
  nWords = 1 << ((char)iVar2 - 5U & 0x1f);
  if (iVar2 < 6) {
    nWords = 1;
  }
  if (0 < vNodes->nSize) {
    lVar3 = 0;
    do {
      if (vTruthStore->nSize <= lVar3) {
LAB_006cb83c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pNode = (Aig_Obj_t *)vNodes->pArray[lVar3];
      pTruth = (uint *)vTruthStore->pArray[lVar3];
      Aig_ManCutTruthOne(pNode,pTruth,nWords);
      (pNode->field_5).pData = pTruth;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vNodes->nSize);
  }
  return (uint *)(pRoot->field_5).pData;
}

Assistant:

unsigned * Aig_ManCutTruth( Aig_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Ptr_t * vTruthElem, Vec_Ptr_t * vTruthStore )
{
    Aig_Obj_t * pObj;
    int i, nWords;
    assert( Vec_PtrSize(vLeaves) <= Vec_PtrSize(vTruthElem) );
    assert( Vec_PtrSize(vNodes) <= Vec_PtrSize(vTruthStore) );
    assert( Vec_PtrSize(vNodes) == 0 || pRoot == Vec_PtrEntryLast(vNodes) );  
    // assign elementary truth tables
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        pObj->pData = Vec_PtrEntry( vTruthElem, i );
    // compute truths for other nodes
    nWords = Abc_TruthWordNum( Vec_PtrSize(vLeaves) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        pObj->pData = Aig_ManCutTruthOne( pObj, (unsigned *)Vec_PtrEntry(vTruthStore, i), nWords );
    return (unsigned *)pRoot->pData;
}